

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixy-pktgen.c
# Opt level: O0

int main(int argc,char **argv)

{
  ulong uVar1;
  uint64_t uVar2;
  size_t sVar3;
  undefined4 in_stack_fffffffffffffd48;
  uint32_t in_stack_fffffffffffffd4c;
  ixy_device *in_stack_fffffffffffffd50;
  uint16_t in_stack_fffffffffffffd5e;
  undefined4 in_stack_fffffffffffffd60;
  uint32_t in_stack_fffffffffffffd64;
  pkt_buf **in_stack_fffffffffffffd68;
  mempool *in_stack_fffffffffffffd70;
  device_stats *in_stack_fffffffffffffd78;
  device_stats *in_stack_fffffffffffffd80;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 uVar4;
  device_stats *in_stack_ffffffffffffff50;
  undefined1 *puVar5;
  char *in_stack_ffffffffffffff58;
  uint64_t time;
  uint32_t i;
  int local_8c;
  undefined1 local_88 [4];
  uint32_t seq_num;
  device_stats stats;
  device_stats stats_old;
  uint64_t counter;
  uint64_t last_stats_printed;
  mempool *mempool;
  ixy_device *dev;
  char **argv_local;
  int argc_local;
  
  if (argc == 2) {
    uVar4 = 0;
    ixy_init(in_stack_ffffffffffffff58,(uint16_t)((ulong)in_stack_ffffffffffffff50 >> 0x30),
             (uint16_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),(int)in_stack_ffffffffffffff50);
    init_mempool();
    counter = monotonic_time();
    stats_old.tx_bytes = 0;
    stats_init(in_stack_ffffffffffffff50,(ixy_device *)CONCAT44(uVar4,in_stack_ffffffffffffff48));
    stats_init(in_stack_ffffffffffffff50,(ixy_device *)CONCAT44(uVar4,in_stack_ffffffffffffff48));
    local_8c = 0;
    puVar5 = &stack0xfffffffffffffd48;
    do {
      pkt_buf_alloc_batch(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                          in_stack_fffffffffffffd64);
      for (time._4_4_ = 0; time._4_4_ < 0x40; time._4_4_ = time._4_4_ + 1) {
        *(int *)(*(long *)(puVar5 + (ulong)time._4_4_ * 8) + 0x78) = local_8c;
        local_8c = local_8c + 1;
      }
      ixy_tx_batch_busy_wait
                ((ixy_device *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                 in_stack_fffffffffffffd5e,(pkt_buf **)in_stack_fffffffffffffd50,
                 in_stack_fffffffffffffd4c);
      sVar3 = stats_old.tx_bytes + 1;
      uVar1 = stats_old.tx_bytes & 0xfff;
      stats_old.tx_bytes = sVar3;
      if ((uVar1 == 0) && (uVar2 = monotonic_time(), 1000000000 < uVar2 - counter)) {
        ixy_read_stats(in_stack_fffffffffffffd50,
                       (device_stats *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48)
                      );
        print_stats_diff(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                         (uint64_t)in_stack_fffffffffffffd70);
        memcpy(&stats.tx_bytes,local_88,0x28);
        counter = uVar2;
      }
    } while( true );
  }
  printf("Usage: %s <pci bus id>\n",*argv);
  return 1;
}

Assistant:

int main(int argc, char* argv[]) {
	if (argc != 2) {
		printf("Usage: %s <pci bus id>\n", argv[0]);
		return 1;
	}

	struct ixy_device* dev = ixy_init(argv[1], 1, 1, 0);
	struct mempool* mempool = init_mempool();

	uint64_t last_stats_printed = monotonic_time();
	uint64_t counter = 0;
	struct device_stats stats_old, stats;
	stats_init(&stats, dev);
	stats_init(&stats_old, dev);
	uint32_t seq_num = 0;

	// array of bufs sent out in a batch
	struct pkt_buf* bufs[BATCH_SIZE];

	// tx loop
	while (true) {
		// we cannot immediately recycle packets, we need to allocate new packets every time
		// the old packets might still be used by the NIC: tx is async
		pkt_buf_alloc_batch(mempool, bufs, BATCH_SIZE);
		for (uint32_t i = 0; i < BATCH_SIZE; i++) {
			// packets can be modified here, make sure to update the checksum when changing the IP header
			*(uint32_t*)(bufs[i]->data + PKT_SIZE - 4) = seq_num++;
		}
		// the packets could be modified here to generate multiple flows
		ixy_tx_batch_busy_wait(dev, 0, bufs, BATCH_SIZE);

		// don't check time for every packet, this yields +10% performance :)
		if ((counter++ & 0xFFF) == 0) {
			uint64_t time = monotonic_time();
			if (time - last_stats_printed > 1000 * 1000 * 1000) {
				// every second
				ixy_read_stats(dev, &stats);
				print_stats_diff(&stats, &stats_old, time - last_stats_printed);
				stats_old = stats;
				last_stats_printed = time;
			}
		}
		// track stats
	}
}